

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Emu.cpp
# Opt level: O3

void get_spc_info(header_t *h,byte_ *xid6,long xid6_size,track_info_t *out)

{
  byte_ bVar1;
  uint in_size;
  bool bVar2;
  byte_ *pbVar3;
  byte_ *pbVar4;
  byte *pbVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  byte_ *pbVar9;
  uint uVar10;
  byte_ *pbVar11;
  byte_ *pbVar12;
  char *out_00;
  byte_ *pbVar13;
  ulong uVar14;
  size_t local_170;
  byte local_138 [3];
  byte local_135 [261];
  
  lVar7 = 0;
  uVar14 = 0;
  do {
    uVar10 = h->len_secs[lVar7] - 0x30;
    if (9 < uVar10) {
      if (lVar7 == 1) {
        if (h->author[1] == '\0') {
          uVar14 = 0;
        }
        if (h->author[0] != '\0') {
          uVar14 = 0;
        }
      }
      break;
    }
    uVar14 = (ulong)uVar10 + uVar14 * 10;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  uVar8 = uVar14;
  if (0x1fff < (long)uVar14) {
    uVar8 = (ulong)*(ushort *)h->len_secs;
  }
  if (uVar14 == 0) {
    uVar8 = (ulong)*(ushort *)h->len_secs;
  }
  if ((long)uVar8 < 0x1fff) {
    out->length = uVar8 * 1000;
  }
  bVar2 = (byte)h->author[0] - 0x30 < 10 || h->author[0] < ' ';
  Gme_File::copy_field_(out->author,h->author + bVar2,0x20 - (uint)bVar2);
  Gme_File::copy_field_(out->song,h->song,0x20);
  Gme_File::copy_field_(out->game,h->game,0x20);
  Gme_File::copy_field_(out->dumper,h->dumper,0x10);
  Gme_File::copy_field_(out->comment,h->comment,0x20);
  if (((xid6_size != 0) && (7 < xid6_size)) && (*(int *)xid6 == 0x36646978)) {
    pbVar13 = xid6 + (ulong)*(uint *)(xid6 + 4) + 8;
    if (xid6_size - 8U <= (ulong)*(uint *)(xid6 + 4)) {
      pbVar13 = xid6 + xid6_size;
    }
    pbVar11 = xid6 + 8;
    if (3 < (long)pbVar13 - (long)pbVar11) {
      uVar10 = 0;
      local_170 = 0;
      do {
        in_size = (uint)*(ushort *)(pbVar11 + 2);
        if (pbVar11[1] == '\0') {
          in_size = 0;
        }
        uVar14 = (ulong)in_size;
        pbVar12 = pbVar11 + 4;
        if ((long)pbVar13 - (long)pbVar12 < (long)uVar14) break;
        bVar1 = *pbVar11;
        out_00 = out->song;
        switch(bVar1) {
        case '\x01':
          break;
        case '\x02':
          out_00 = out->game;
          break;
        case '\x03':
          out_00 = out->author;
          break;
        case '\x04':
          out_00 = out->dumper;
          break;
        case '\x05':
        case '\x06':
          goto switchD_006e4c1d_caseD_5;
        case '\a':
          out_00 = out->comment;
          break;
        default:
          if (bVar1 == '\x13') {
            local_170 = 0x100;
            if (in_size < 0x100) {
              local_170 = (size_t)in_size;
            }
            memcpy(local_135 + 2,pbVar12,local_170);
          }
          else if (bVar1 == '\x14') {
            uVar10 = (uint)*(ushort *)(pbVar11 + 2);
          }
          goto switchD_006e4c1d_caseD_5;
        }
        Gme_File::copy_field_(out_00,(char *)pbVar12,in_size);
switchD_006e4c1d_caseD_5:
        pbVar12 = pbVar12 + uVar14;
        pbVar3 = pbVar11 + uVar14 + 4;
        pbVar9 = pbVar12;
        do {
          pbVar4 = pbVar3;
          pbVar11 = pbVar9;
          if ((pbVar13 <= pbVar9) || (((int)pbVar3 - (int)xid6 & 3U) == 0)) break;
          pbVar3 = pbVar3 + 1;
          bVar1 = *pbVar9;
          pbVar9 = pbVar9 + 1;
          pbVar4 = pbVar12;
          pbVar11 = pbVar12;
        } while (bVar1 == '\0');
      } while (3 < (long)pbVar13 - (long)pbVar4);
      if (uVar10 == 0) {
        pbVar5 = local_135 + 2;
        if ((int)local_170 == 0) {
          return;
        }
      }
      else {
        pbVar5 = local_135;
        local_135[1] = 0x20;
        iVar6 = -4;
        do {
          *pbVar5 = (char)uVar10 + (char)(uVar10 / 10) * -10 | 0x30;
          pbVar5 = pbVar5 + -1;
          uVar10 = uVar10 / 10;
          iVar6 = iVar6 + 1;
        } while (iVar6 != 0);
        local_170._0_4_ = (int)local_170 + 5;
        pbVar5 = local_138;
      }
      Gme_File::copy_field_(out->copyright,(char *)pbVar5,(int)local_170);
    }
  }
  return;
}

Assistant:

static void get_spc_info( Spc_Emu::header_t const& h, byte const* xid6, long xid6_size,
		track_info_t* out )
{
	// decode length (can be in text or binary format, sometimes ambiguous ugh)
	long len_secs = 0;
	for ( int i = 0; i < 3; i++ )
	{
		unsigned n = h.len_secs [i] - '0';
		if ( n > 9 )
		{
			// ignore single-digit text lengths
			// (except if author field is present and begins at offset 1, ugh)
			if ( i == 1 && (h.author [0] || !h.author [1]) )
				len_secs = 0;
			break;
		}
		len_secs *= 10;
		len_secs += n;
	}
	if ( !len_secs || len_secs > 0x1FFF )
		len_secs = get_le16( h.len_secs );
	if ( len_secs < 0x1FFF )
		out->length = len_secs * 1000;
	
	int offset = (h.author [0] < ' ' || unsigned (h.author [0] - '0') <= 9);
	Gme_File::copy_field_( out->author, &h.author [offset], sizeof h.author - offset );
	
	GME_COPY_FIELD( h, out, song );
	GME_COPY_FIELD( h, out, game );
	GME_COPY_FIELD( h, out, dumper );
	GME_COPY_FIELD( h, out, comment );
	
	if ( xid6_size )
		get_spc_xid6( xid6, xid6_size, out );
}